

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rusage.c
# Opt level: O0

char * blogc_rusage_format_cpu_time(longlong time)

{
  undefined8 uVar1;
  longlong time_local;
  
  if (time < 1000000) {
    if (time < 1000) {
      time_local = (longlong)bc_strdup_printf("%dus",time);
    }
    else {
      uVar1 = 0;
      if (time % 1000 != 0) {
        uVar1 = 3;
      }
      time_local = (longlong)bc_strdup_printf("%.*fms",(double)time / 1000.0,uVar1);
    }
  }
  else {
    time_local = (longlong)bc_strdup_printf("%.3fs",(double)time / 1000000.0);
  }
  return (char *)time_local;
}

Assistant:

char*
blogc_rusage_format_cpu_time(long long time)
{
    if (time >= 1000000)
        return bc_strdup_printf("%.3fs", ((float) time) / 1000000.0);

    // this is a special case: some systems may report the cpu time rounded up to the
    // milisecond. it is useless to show ".000" in this case.
    if (time >= 1000)
        return bc_strdup_printf("%.*fms", time % 1000 ? 3 : 0, ((float) time) / 1000.0);

    return bc_strdup_printf("%dus", time);
}